

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

float get_long_short_ratio_y(void)

{
  Am_Value *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Object local_20;
  
  pAVar1 = (Am_Value *)Am_Object::Get(0xe3e8,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(0xe428,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar1);
  Am_Object::Get_Object((ushort)&local_20,0x10e3d8);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x182);
  iVar4 = Am_Value::operator_cast_to_int(pAVar1);
  Am_Object::~Am_Object(&local_20);
  return (float)(iVar2 - iVar3) / (float)iVar4;
}

Assistant:

float
get_long_short_ratio_y()
{
  int max_long_y =
      (int)(SP_Long_Win.Get(Am_HEIGHT)) - (int)(SP_Long_Feed.Get(Am_HEIGHT));
  int max_short_y = SP_Scroll_Agg.Get_Object(Am_V_SCROLLER).Get(Am_VALUE_2);
  return ((float)max_long_y / max_short_y);
}